

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void __thiscall
duckdb::BitpackingScanState<unsigned_short,_short>::BitpackingScanState
          (BitpackingScanState<unsigned_short,_short> *this,ColumnSegment *segment)

{
  data_ptr_t pdVar1;
  BufferManager *pBVar2;
  BufferHandle BStack_38;
  
  (this->super_SegmentScanState)._vptr_SegmentScanState =
       (_func_int **)&PTR__BitpackingScanState_024b37c8;
  BufferHandle::BufferHandle(&this->handle);
  this->current_segment = segment;
  this->current_group_offset = 0;
  pBVar2 = BufferManager::GetBufferManager(segment->db);
  (*pBVar2->_vptr_BufferManager[7])(&BStack_38,pBVar2,&segment->block);
  BufferHandle::operator=(&this->handle,&BStack_38);
  BufferHandle::~BufferHandle(&BStack_38);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(this->handle).node);
  pdVar1 = ((this->handle).node.ptr)->buffer;
  this->bitpacking_metadata_ptr =
       pdVar1 + *(long *)(pdVar1 + segment->offset) + -4 + segment->offset;
  LoadNextGroup(this);
  return;
}

Assistant:

explicit BitpackingScanState(ColumnSegment &segment) : current_segment(segment) {
		auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
		handle = buffer_manager.Pin(segment.block);
		auto data_ptr = handle.Ptr();

		// load offset to bitpacking widths pointer
		auto bitpacking_metadata_offset = Load<idx_t>(data_ptr + segment.GetBlockOffset());
		bitpacking_metadata_ptr =
		    data_ptr + segment.GetBlockOffset() + bitpacking_metadata_offset - sizeof(bitpacking_metadata_encoded_t);

		// load the first group
		LoadNextGroup();
	}